

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_footprints.cpp
# Opt level: O2

void __thiscall cp::PlanFootprints::calcNextFootprint(PlanFootprints *this)

{
  QuaternionBase<Eigen::Quaternion<double,_0>_> *this_00;
  Quat ref_land_pose_q;
  Vector3 ref_land_pose_p;
  Quat local_78;
  Vector3 local_50;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_38 [24];
  
  this_00 = (QuaternionBase<Eigen::Quaternion<double,_0>_> *)(this + 0x1f0);
  Eigen::QuaternionBase<Eigen::Quaternion<double,_0>_>::_transformVector
            (&local_50,this_00,(Vector3 *)(this + (ulong)*(uint *)(this + 0x2e0) * 0x18 + 0x4d8));
  local_78.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
  array[0] = (double)(this + 0x1d0);
  local_78.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
  array[1] = (double)&local_50;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            (local_38,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       *)&local_78);
  Eigen::internal::
  quat_product<1,_Eigen::Quaternion<double,_0>,_Eigen::Quaternion<double,_0>,_double>::run
            (this_00,(QuaternionBase<Eigen::Quaternion<double,_0>_> *)(this + 0x330));
  Pose::set((Pose *)(this + (ulong)*(uint *)(this + 0x2e0) * 0xe0 + 0x10),(Vector3 *)local_38,
            &local_78);
  Eigen::internal::call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>
            ((Matrix<double,_4,_1,_0,_4,_1> *)(this + 0x2b0),
             (Matrix<double,_4,_1,_0,_4,_1> *)this_00);
  return;
}

Assistant:

void PlanFootprints::calcNextFootprint() {
  Vector3 ref_land_pose_p = ref_waist_pose.p() +
                            ref_waist_pose.q() * dist_body2foot[swingleg];
  Quat ref_land_pose_q    = ref_waist_pose.q() * init_feet_pose[0].q();
  ref_land_pose[swingleg].set(ref_land_pose_p, ref_land_pose_q);
  ref_waist_r = ref_waist_pose.q();
}